

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall
dxil_spv::CFGStructurizer::hoist_switch_branches_to_frontier
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge,CFGNode *dominance_frontier_candidate)

{
  SPIRVModule *this_00;
  bool bVar1;
  uint32_t id;
  Id type_id;
  reference ppCVar2;
  Vector<Case> *pVVar3;
  Builder *this_01;
  reference pPVar4;
  reference pIVar5;
  Vector<CFGNode_*> *this_02;
  iterator __first;
  iterator __last;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_130;
  const_iterator local_128;
  reference local_120;
  Case *c_1;
  iterator __end2_2;
  iterator __begin2_2;
  Vector<Case> *__range2_2;
  CFGNode **p;
  iterator __end2_1;
  iterator __begin2_1;
  Vector<CFGNode_*> *__range2_1;
  IncomingValue *incoming;
  iterator __end4;
  iterator __begin4;
  Vector<IncomingValue> *__range4;
  PHI *phi;
  iterator __end3;
  iterator __begin3;
  Vector<PHI> *__range3;
  Operation *bor;
  Operation *ieq;
  Case *c;
  iterator __end2;
  iterator __begin2;
  Vector<Case> *__range2;
  CFGNode *pCStack_68;
  Id cond_id;
  CFGNode *succ;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  Vector<CFGNode_*> succs;
  CFGNode *pred;
  CFGNode *dominance_frontier_candidate_local;
  CFGNode *merge_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  succs.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)create_helper_pred_block(this,node);
  std::swap<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>
            (&(((CFGNode *)
               succs.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->ir).operations,
             &(node->ir).operations);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &__range1,&node->succ);
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  *)&__range1);
  succ = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&succ);
    if (!bVar1) goto LAB_001997ea;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    pCStack_68 = *ppCVar2;
    bVar1 = query_reachability(this,pCStack_68,dominance_frontier_candidate);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  __range2._4_4_ = 0;
  pVVar3 = &(node->ir).terminator.cases;
  __end2 = std::
           vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
           ::begin(pVVar3);
  c = (Case *)std::
              vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
              ::end(pVVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<dxil_spv::Terminator::Case_*,_std::vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>_>
                                     *)&c), bVar1) {
    ieq = (Operation *)
          __gnu_cxx::
          __normal_iterator<dxil_spv::Terminator::Case_*,_std::vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>_>
          ::operator*(&__end2);
    if (*(CFGNode **)ieq == pCStack_68) {
      bor = build_switch_case_equal_check
                      (this,node,
                       (CFGNode *)
                       succs.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(Case *)ieq);
      if (__range2._4_4_ == 0) {
        __range2._4_4_ = bor->id;
      }
      else {
        this_00 = this->module;
        id = SPIRVModule::allocate_id(this->module);
        this_01 = SPIRVModule::get_builder(this->module);
        type_id = spv::Builder::makeBoolType(this_01);
        __range3 = (Vector<PHI> *)SPIRVModule::allocate_op(this_00,OpLogicalOr,id,type_id);
        Operation::add_id((Operation *)__range3,__range2._4_4_);
        Operation::add_id((Operation *)__range3,bor->id);
        std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
        push_back((vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                   *)(succs.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 9),
                  (value_type *)&__range3);
        __range2._4_4_ =
             *(Id *)((long)&(__range3->
                            super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                            )._M_impl.super__Vector_impl_data._M_start + 4);
      }
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::Terminator::Case_*,_std::vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>_>
    ::operator++(&__end2);
  }
  if (pCStack_68 == dominance_frontier_candidate) {
    __end3 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::begin
                       (&(dominance_frontier_candidate->ir).phi);
    phi = (PHI *)std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::end
                           (&(dominance_frontier_candidate->ir).phi);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                                       *)&phi), bVar1) {
      pPVar4 = __gnu_cxx::
               __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
               ::operator*(&__end3);
      __end4 = std::
               vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               ::begin(&pPVar4->incoming);
      incoming = (IncomingValue *)
                 std::
                 vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                 ::end(&pPVar4->incoming);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
                                         *)&incoming), bVar1) {
        pIVar5 = __gnu_cxx::
                 __normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
                 ::operator*(&__end4);
        if (pIVar5->block == node) {
          pIVar5->block =
               (CFGNode *)
               succs.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
        ::operator++(&__end4);
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
      ::operator++(&__end3);
    }
  }
  this_02 = &pCStack_68->pred;
  __end2_1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(this_02);
  p = (CFGNode **)
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                (this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                             *)&p), bVar1) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end2_1);
    if (*ppCVar2 == node) {
      *ppCVar2 = (CFGNode *)
                 succs.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end2_1);
  }
  pVVar3 = &(node->ir).terminator.cases;
  __end2_2 = std::
             vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
             ::begin(pVVar3);
  c_1 = (Case *)std::
                vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                ::end(pVVar3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<dxil_spv::Terminator::Case_*,_std::vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>_>
                             *)&c_1), bVar1) {
    local_120 = __gnu_cxx::
                __normal_iterator<dxil_spv::Terminator::Case_*,_std::vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>_>
                ::operator*(&__end2_2);
    if (local_120->node == pCStack_68) {
      local_120->node = merge;
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::Terminator::Case_*,_std::vector<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>_>
    ::operator++(&__end2_2);
  }
  __first = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            begin(&node->succ);
  __last = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           end(&node->succ);
  local_130 = std::
              find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode*>
                        (__first._M_current,__last._M_current,&stack0xffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
  ::__normal_iterator<dxil_spv::CFGNode**>
            ((__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
              *)&local_128,&local_130);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::erase
            (&node->succ,local_128);
  CFGNode::add_branch(node,merge);
  CFGNode::add_branch((CFGNode *)
                      succs.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pCStack_68);
  if (pCStack_68 == dominance_frontier_candidate) {
    pCStack_68 = CFGNode::rewrite_branch_through_intermediate_node
                           ((CFGNode *)
                            succs.
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            dominance_frontier_candidate,dominance_frontier_candidate);
  }
  *(undefined4 *)
   ((long)succs.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x84) = 2;
  *(Id *)(succs.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) = __range2._4_4_;
  succs.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage[0x12] = pCStack_68;
  succs.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage[0x13] = node;
  succs.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage[0x11] = (CFGNode *)0x0;
LAB_001997ea:
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::~vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &__range1);
  return;
}

Assistant:

void CFGStructurizer::hoist_switch_branches_to_frontier(CFGNode *node, CFGNode *merge,
                                                        CFGNode *dominance_frontier_candidate)
{
	// Dispatch to the dominance frontier before we enter switch scope.
	auto *pred = create_helper_pred_block(node);
	std::swap(pred->ir.operations, node->ir.operations);

	auto succs = node->succ;
	for (auto *succ : succs)
	{
		if (!query_reachability(*succ, *dominance_frontier_candidate))
			continue;

		// Rewrite the case label to reach merge block in a unique path.
		// That way we can PHI select whether to branch to dominance frontier or not
		// in the switch merge block.

		spv::Id cond_id = 0;
		for (auto &c : node->ir.terminator.cases)
		{
			if (c.node == succ)
			{
				auto *ieq = build_switch_case_equal_check(node, pred, c);

				if (cond_id)
				{
					auto *bor = module.allocate_op(spv::OpLogicalOr, module.allocate_id(),
					                               module.get_builder().makeBoolType());
					bor->add_id(cond_id);
					bor->add_id(ieq->id);
					pred->ir.operations.push_back(bor);
					cond_id = bor->id;
				}
				else
				{
					cond_id = ieq->id;
				}
			}
		}

		if (succ == dominance_frontier_candidate)
		{
			// We're directly branching to target, so might have to rewrite PHI incoming
			// block to pred helper block instead.
			for (auto &phi : dominance_frontier_candidate->ir.phi)
				for (auto &incoming : phi.incoming)
					if (incoming.block == node)
						incoming.block = pred;
		}

		for (auto *&p : succ->pred)
			if (p == node)
				p = pred;

		for (auto &c : node->ir.terminator.cases)
			if (c.node == succ)
				c.node = merge;

		node->succ.erase(std::find(node->succ.begin(), node->succ.end(), succ));
		node->add_branch(merge);
		pred->add_branch(succ);

		// Make sure that our selection branch has somewhere to merge if it has to.
		if (succ == dominance_frontier_candidate)
		{
			succ = pred->rewrite_branch_through_intermediate_node(dominance_frontier_candidate,
			                                                      dominance_frontier_candidate);
		}

		pred->ir.terminator.type = Terminator::Type::Condition;
		pred->ir.terminator.conditional_id = cond_id;
		pred->ir.terminator.true_block = succ;
		pred->ir.terminator.false_block = node;
		pred->ir.terminator.direct_block = nullptr;

		// Have to assume that there is only one path to this frontier,
		// otherwise we're in a world of impossible case merges
		// which should have been handled elsewhere ...
		return;
	}
}